

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

StreamOut * prvTidyBufferOutput(TidyDocImpl *doc,TidyBuffer *buf,int encoding,uint nl)

{
  StreamOut *pSVar1;
  
  pSVar1 = (StreamOut *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x20);
  pSVar1->encoding = 0;
  pSVar1->state = FSM_ASCII;
  pSVar1->nl = 0;
  pSVar1->iotype = FileIO;
  (pSVar1->sink).sinkData = (void *)0x0;
  (pSVar1->sink).putByte = (TidyPutByteFunc)0x0;
  pSVar1->encoding = encoding;
  pSVar1->state = FSM_ASCII;
  pSVar1->nl = nl;
  tidyInitOutputBuffer(&pSVar1->sink,buf);
  pSVar1->iotype = BufferIO;
  return pSVar1;
}

Assistant:

StreamOut* TY_(BufferOutput)( TidyDocImpl *doc, TidyBuffer* buf, int encoding, uint nl )
{
    StreamOut* out = initStreamOut( doc, encoding, nl );
    tidyInitOutputBuffer( &out->sink, buf );
    out->iotype = BufferIO;
    return out;
}